

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_attr_sz(exr_context_t ctxt,size_t sz)

{
  ulong in_RSI;
  long in_RDI;
  int32_t isz;
  undefined4 local_1c [3];
  long local_10;
  exr_result_t local_4;
  
  if (in_RSI < 0x80000000) {
    local_1c[0] = (undefined4)in_RSI;
    local_10 = in_RDI;
    priv_from_native32(local_1c,1);
    local_4 = (**(code **)(local_10 + 0x30))(local_10,local_1c,4,local_10 + 0xb0);
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
  }
  return local_4;
}

Assistant:

static exr_result_t
save_attr_sz (exr_context_t ctxt, size_t sz)
{
    int32_t isz;

    if (sz > (size_t) INT32_MAX)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    isz = (int32_t) sz;
    priv_from_native32 (&isz, 1);

    return ctxt->do_write (
        ctxt, &isz, sizeof (int32_t), &(ctxt->output_file_offset));
}